

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexFactory.cpp
# Opt level: O0

MutexFactory * MutexFactory::i(void)

{
  pointer pMVar1;
  MutexFactory *this;
  unique_ptr<MutexFactory,_std::default_delete<MutexFactory>_> *in_stack_fffffffffffffff0;
  
  pMVar1 = std::unique_ptr<MutexFactory,_std::default_delete<MutexFactory>_>::get
                     (in_stack_fffffffffffffff0);
  if (pMVar1 == (pointer)0x0) {
    this = (MutexFactory *)operator_new(0x30);
    MutexFactory(this);
    std::unique_ptr<MutexFactory,_std::default_delete<MutexFactory>_>::reset
              (in_stack_fffffffffffffff0,this);
  }
  pMVar1 = std::unique_ptr<MutexFactory,_std::default_delete<MutexFactory>_>::get
                     (in_stack_fffffffffffffff0);
  return pMVar1;
}

Assistant:

MutexFactory* MutexFactory::i()
{
	if (!instance.get())
	{
		instance.reset(new MutexFactory());
	}

	return instance.get();
}